

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_smart_cover::state_read(se_smart_cover *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((se_smart_cover *)&this[-1].m_last_description.field_2,in_RSI,in_DX);
  return;
}

Assistant:

void se_smart_cover::state_read(xr_packet& packet, uint16_t size)
{
	cse_smart_cover::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		packet.r_sz(m_last_description);
		packet.r_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			m_loopholes = new std::vector<loophole>();

			m_loopholes->reserve(m_loopholes_count);

			for (int i = 0; i < m_loopholes_count; ++i)
			{
				std::string *id = new std::string;
				packet.r_sz(*id);
				m_loopholes->push_back(loophole(id->c_str(), packet.r_bool()));
			}
		}
	}
}